

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::Dump(Instr *this,IRDumpFlags flags)

{
  ushort uVar1;
  undefined2 uVar2;
  Kind KVar3;
  long *plVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint left;
  int32 iVar11;
  int iVar12;
  undefined4 *puVar13;
  IntConstOpnd *pIVar14;
  BranchInstr *this_00;
  PragmaInstr *pPVar15;
  MultiBranchInstr *pMVar16;
  JITTimeFunctionBody *this_01;
  ParseableFunctionInfo *pPVar17;
  undefined4 extraout_var;
  RegOpnd *pRVar18;
  _func_int **pp_Var19;
  BailOutInfo *pBVar20;
  char16 *pcVar21;
  long lVar22;
  ulong uVar23;
  undefined4 in_register_00000034;
  void **value;
  Opnd *pOVar24;
  char16_t *pcVar25;
  char *pcVar26;
  long lVar27;
  anon_class_1_1_3fcf6586_for_fn *this_02;
  bool bVar28;
  BVUnitT<unsigned_long> local_a8;
  int32 temp;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c PrintOpCodeName;
  ByteCodeUsesInstr *tempbcu;
  
  value = (void **)CONCAT44(in_register_00000034,flags);
  uVar2 = this->m_opcode;
  local_50.this = this;
  if ((ushort)(uVar2 - 0x207) < 2) {
    Dump::anon_class_8_1_8991fb9c::operator()(&local_50);
    pOVar24 = this->m_src1;
    if (pOVar24 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1183,"(GetSrc1())","GetSrc1()");
      if (!bVar6) goto LAB_00486d88;
      *puVar13 = 0;
      pOVar24 = this->m_src1;
    }
    bVar6 = Opnd::IsIntConstOpnd(pOVar24);
    if (bVar6) {
      pIVar14 = Opnd::AsIntConstOpnd(this->m_src1);
      Output::Print(L"%d",(pIVar14->super_EncodableOpnd<long>).m_value);
    }
    else {
      Opnd::Dump(this->m_src1,flags,this->m_func);
    }
    if (this->m_dst == (Opnd *)0x0) {
      left = 0;
    }
    else {
      pIVar14 = Opnd::AsIntConstOpnd(this->m_dst);
      left = IntConstOpnd::AsInt32(pIVar14);
    }
    pcVar26 = "<=";
    tempbcu = (ByteCodeUsesInstr *)0x2b;
    if (this->m_src2 == (Opnd *)0x0) {
LAB_00486540:
      bVar6 = false;
    }
    else {
      bVar6 = Opnd::IsIntConstOpnd(this->m_src2);
      if (bVar6) {
        pIVar14 = Opnd::AsIntConstOpnd(this->m_src2);
        iVar11 = IntConstOpnd::AsInt32(pIVar14);
        bVar6 = Int32Math::Add(left,iVar11,(int32 *)&local_a8);
        if (bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x1197,
                             "(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp))"
                             ,
                             "!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp)"
                            );
          if (!bVar6) goto LAB_00486d88;
          *puVar13 = 0;
        }
        pIVar14 = Opnd::AsIntConstOpnd(this->m_src2);
        iVar11 = IntConstOpnd::AsInt32(pIVar14);
        left = left + iVar11;
        goto LAB_00486540;
      }
      bVar6 = true;
      if (left == 0xffffffff) {
        pcVar26 = "<";
        left = 0;
      }
      else {
        bVar28 = 0x80000000 < left;
        if (bVar28) {
          left = -left;
        }
        tempbcu = (ByteCodeUsesInstr *)(ulong)((uint)bVar28 * 2 + 0x2b);
      }
    }
    Output::Print(L" %S ",pcVar26);
    if (bVar6) {
      Opnd::Dump(this->m_src2,flags,this->m_func);
      if (left == 0) goto LAB_00486c23;
      Output::Print(L" %C ",tempbcu);
    }
    else if (left == 0) goto LAB_00486c23;
    pcVar25 = L"%d";
  }
  else {
    Output::SkipToColumn(4);
    if (this->m_dst != (Opnd *)0x0) {
      Opnd::Dump(this->m_dst,flags,this->m_func);
      uVar9 = Func::GetSourceContextId(this->m_func);
      uVar10 = Func::GetLocalFunctionId(this->m_func);
      bVar28 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,MarkTempPhase,uVar9,uVar10);
      bVar6 = true;
      bVar8 = true;
      if (bVar28) {
LAB_004863f9:
        if ((this->field_0x36 & 6) != 0) goto LAB_00486407;
LAB_00486787:
        if (bVar8 != false) goto LAB_0048678c;
      }
      else {
        uVar9 = Func::GetSourceContextId(this->m_func);
        uVar10 = Func::GetLocalFunctionId(this->m_func);
        bVar28 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MarkTempPhase,uVar9,uVar10);
        if (bVar28) goto LAB_004863f9;
        uVar9 = Func::GetSourceContextId(this->m_func);
        uVar10 = Func::GetLocalFunctionId(this->m_func);
        bVar28 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,MarkTempNumberPhase,uVar9,uVar10);
        bVar7 = true;
        if (!bVar28) {
          uVar9 = Func::GetSourceContextId(this->m_func);
          uVar10 = Func::GetLocalFunctionId(this->m_func);
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MarkTempNumberPhase,uVar9,uVar10);
        }
        uVar9 = Func::GetSourceContextId(this->m_func);
        uVar10 = Func::GetLocalFunctionId(this->m_func);
        bVar28 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,MarkTempObjectPhase,uVar9,uVar10);
        if (!bVar28) {
          uVar9 = Func::GetSourceContextId(this->m_func);
          uVar10 = Func::GetLocalFunctionId(this->m_func);
          bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MarkTempObjectPhase,uVar9,uVar10);
          if (bVar7 != false) goto LAB_004863f9;
          bVar6 = false;
          goto LAB_00486787;
        }
        bVar8 = true;
        if (bVar7 != false) goto LAB_004863f9;
        bVar6 = false;
LAB_0048678c:
        bVar8 = true;
        if ((this->field_0x36 & 8) != 0) {
LAB_00486407:
          Output::Print(L"[");
          if ((bVar6) &&
             ((DAT_0145948a != '\0' ||
              (bVar6 = OpCodeAttr::TempNumberProducing(this->m_opcode), bVar6)))) {
            uVar1 = *(ushort *)&this->field_0x36;
            if ((uVar1 & 4) == 0) {
              if ((uVar1 & 2) == 0) goto LAB_004866fa;
              pcVar21 = L"#";
            }
            else {
              pcVar21 = L"x";
              if ((uVar1 & 2) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar13 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                                   ,0x11d6,"(this->dstIsTempNumber)","this->dstIsTempNumber");
                if (!bVar6) goto LAB_00486d88;
                *puVar13 = 0;
              }
            }
            Output::Print(pcVar21);
          }
LAB_004866fa:
          if ((bVar8 != false) &&
             (((DAT_0145948a != '\0' ||
               (bVar6 = OpCodeAttr::TempObjectProducing(this->m_opcode), bVar6)) &&
              ((this->field_0x36 & 8) != 0)))) {
            Output::Print(L"o");
          }
          Output::Print(L"tmp]");
        }
      }
      uVar9 = Func::GetSourceContextId(this->m_func->topFunc);
      uVar10 = Func::GetLocalFunctionId(this->m_func->topFunc);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,TrackNegativeZeroPhase,uVar9,uVar10);
      if ((bVar6) && ((this->field_0x36 & 0x40) != 0)) {
        Output::Print(L"[-0]");
      }
      uVar9 = Func::GetSourceContextId(this->m_func->topFunc);
      uVar10 = Func::GetLocalFunctionId(this->m_func->topFunc);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,TypedArrayVirtualPhase,uVar9,uVar10);
      if (bVar6) {
        if ((*(ushort *)&this->field_0x36 >> 0xe & 1) == 0) {
          if (-1 < (short)*(ushort *)&this->field_0x36) goto LAB_0048684f;
          pcVar25 = L"[->n]";
        }
        else {
          pcVar25 = L"[->i]";
        }
        Output::Print(pcVar25);
      }
LAB_0048684f:
      uVar9 = Func::GetSourceContextId(this->m_func->topFunc);
      uVar10 = Func::GetLocalFunctionId(this->m_func->topFunc);
      value = (void **)0x66;
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,TrackIntOverflowPhase,uVar9,uVar10);
      if ((bVar6) && ((*(ushort *)&this->field_0x36 & 0x180) != 0)) {
        value = (void **)(ulong)this->ignoreOverflowBitCount;
        if (this->ignoreOverflowBitCount == 0x20) {
          Output::Print(L"[OF]");
        }
        else {
          Output::Print(L"[OF %d]");
        }
      }
      bVar6 = (this->field_0x38 & 0x20) == 0;
      pcVar25 = L"<==";
      if (bVar6) {
        pcVar25 = L"=";
      }
      Output::SkipToColumn((ulong)bVar6 + 0x13);
      Output::Print(pcVar25);
    }
    Dump::anon_class_8_1_8991fb9c::operator()(&local_50);
    if (this->m_kind == InstrKindBranch) {
      this_00 = AsBranchInstr(this);
      if (this_00->m_branchTarget == (LabelInstr *)0x0) {
        if ((this_00->m_isMultiBranch == true) &&
           (bVar6 = BranchInstr::IsMultiBranch(this_00), bVar6)) {
          pMVar16 = BranchInstr::AsMultiBrInstr(this_00);
          if (this->m_opcode != MultiBr) goto LAB_00486a27;
          plVar4 = (long *)pMVar16->m_branchTargets;
          if (plVar4 != (long *)0x0) {
            KVar3 = pMVar16->m_kind;
            if ((KVar3 == IntJumpTable) || (KVar3 == SingleCharStrJumpTable)) {
              lVar22 = pMVar16->m_baseCaseValue;
              lVar27 = lVar22 * 8 + *plVar4;
              for (; lVar22 <= pMVar16->m_lastCaseValue; lVar22 = lVar22 + 1) {
                anon_func::anon_class_1_1_3fcf6586::anon_class_1_1_3fcf6586_for_fn::
                anon_class_1_1_3fcf6586_for_fn::anon_class_1_1_3fcf6586_for_fn::operator()
                          ((anon_class_1_1_3fcf6586_for_fn *)
                           (lVar27 + pMVar16->m_baseCaseValue * -8),value);
                lVar27 = lVar27 + 8;
              }
              this_02 = (anon_class_1_1_3fcf6586_for_fn *)(plVar4 + 1);
            }
            else if (KVar3 == StrDictionary) {
              for (uVar23 = 0; uVar23 < *(uint *)((long)plVar4 + 0x1c); uVar23 = uVar23 + 1) {
                iVar12 = *(int *)(*plVar4 + uVar23 * 4);
                if (iVar12 != -1) {
                  while (iVar12 != -1) {
                    lVar22 = (long)iVar12;
                    iVar12 = *(int *)(plVar4[1] + 8 + lVar22 * 0x18);
                    anon_func::anon_class_1_1_3fcf6586::anon_class_1_1_3fcf6586_for_fn::
                    anon_class_1_1_3fcf6586_for_fn::anon_class_1_1_3fcf6586_for_fn::operator()
                              ((anon_class_1_1_3fcf6586_for_fn *)(plVar4[1] + lVar22 * 0x18),value);
                  }
                }
              }
              this_02 = (anon_class_1_1_3fcf6586_for_fn *)(plVar4 + 7);
            }
            else {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar13 = 1;
              value = (void **)0x435;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                 ,0x435,"(false)","false");
              if (!bVar6) goto LAB_00486d88;
              *puVar13 = 0;
              this_02 = (anon_class_1_1_3fcf6586_for_fn *)0x0;
            }
            anon_func::anon_class_1_1_3fcf6586::anon_class_1_1_3fcf6586_for_fn::
            anon_class_1_1_3fcf6586_for_fn::anon_class_1_1_3fcf6586_for_fn::operator()
                      (this_02,value);
          }
        }
        else {
          Output::Print(L"??");
        }
      }
      else {
        Output::Print(L"$L%d",(ulong)this_00->m_branchTarget->m_id);
      }
      if (this->m_src1 != (Opnd *)0x0) {
        Output::Print(L", ");
      }
    }
    else if ((this->m_kind == InstrKindPragma) && (this->m_opcode == StatementBoundary)) {
      pPVar15 = AsPragmaInstr(this);
      Output::Print(L"#%d",(ulong)pPVar15->m_statementIndex);
    }
LAB_00486a27:
    pOVar24 = this->m_src1;
    if ((this->m_opcode & ~ExtendedOpcodePrefix) == NewScFunc) {
      bVar6 = Opnd::IsIntConstOpnd(pOVar24);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x1245,"(src1->IsIntConstOpnd())","src1->IsIntConstOpnd()");
        if (!bVar6) {
LAB_00486d88:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar13 = 0;
      }
      this_01 = Func::GetJITFunctionBody(this->m_func);
      pPVar17 = (ParseableFunctionInfo *)JITTimeFunctionBody::GetAddr(this_01);
      pIVar14 = Opnd::AsIntConstOpnd(pOVar24);
      pPVar17 = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                          (pPVar17,(uint)(pIVar14->super_EncodableOpnd<long>).m_value);
      pPVar17 = Js::FunctionProxy::GetParseableFunctionInfo(&pPVar17->super_FunctionProxy);
      if (pPVar17 == (ParseableFunctionInfo *)0x0) {
        pcVar25 = L"???";
      }
      else {
        iVar12 = (*(pPVar17->super_FunctionProxy).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pPVar17);
        pcVar25 = (char16_t *)CONCAT44(extraout_var,iVar12);
      }
      Output::Print(L"func:%s()",pcVar25);
      Output::Print(L", env:");
      pRVar18 = Opnd::AsRegOpnd(this->m_src2);
      Sym::Dump(&pRVar18->m_sym->super_Sym,flags,(ValueType)0x9);
    }
    else if (pOVar24 != (Opnd *)0x0) {
      Opnd::Dump(pOVar24,flags,this->m_func);
      pOVar24 = this->m_src2;
      if (pOVar24 != (Opnd *)0x0) {
        Output::Print(L", ");
        Opnd::Dump(pOVar24,flags,this->m_func);
      }
    }
    if (this->m_opcode != SpeculatedLoadFence &&
        (this->m_opcode != ByteCodeUses || this->m_kind != InstrKindByteCodeUses))
    goto LAB_00486c23;
    pp_Var19 = this[1]._vptr_Instr;
    PrintOpCodeName.this._4_4_ = flags;
    if (pp_Var19 != (_func_int **)0x0) {
      bVar6 = true;
      while (pp_Var19 = (_func_int **)*pp_Var19, pp_Var19 != (_func_int **)0x0) {
        iVar12 = *(int *)(pp_Var19 + 1);
        local_a8.word = (Type)pp_Var19[2];
        while ((_func_int *)local_a8.word != (_func_int *)0x0) {
          lVar22 = 0;
          if ((_func_int *)local_a8.word != (_func_int *)0x0) {
            for (; (local_a8.word >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear(&local_a8,(BVIndex)lVar22);
          pcVar25 = L", s%d";
          if (bVar6) {
            pcVar25 = L"s%d";
          }
          bVar6 = false;
          Output::Print(pcVar25,(ulong)(iVar12 + (BVIndex)lVar22));
        }
      }
    }
    flags = PrintOpCodeName.this._4_4_;
    if (*(long *)&this[1].m_noLazyHelperAssert == 0) goto LAB_00486c23;
    left = *(uint *)(*(long *)&this[1].m_noLazyHelperAssert + 0x10);
    pcVar25 = L"  PropSym: %d";
  }
  Output::Print(pcVar25,(ulong)left);
LAB_00486c23:
  if ((flags & (IRDumpFlags_SkipByteCodeOffset|IRDumpFlags_AsmDumpMode)) == IRDumpFlags_None) {
    DumpByteCodeOffset(this);
  }
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) && ((this->field_0x38 & 0x50) != 0)) {
    pBVar20 = GetBailOutInfo(this);
    Output::SkipToColumn(0x55);
    if ((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) {
      Output::Print(L"Bailout: #%04x",(ulong)pBVar20->bailOutOffset);
    }
    if (pBVar20->bailOutFunc->parentFunc != (Func *)0x0) {
      pcVar21 = Func::GetDebugNumberSet(pBVar20->bailOutFunc,(wchar (*) [42])&local_a8);
      Output::Print(L" Func %s",pcVar21);
    }
    pcVar26 = GetBailOutKindName(this);
    Output::Print(L" (%S)",pcVar26);
  }
  if ((flags & IRDumpFlags_SkipEndLine) == IRDumpFlags_None) {
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void
Instr::Dump(IRDumpFlags flags)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    bool const SkipByteCodeOffset = !!(flags & IRDumpFlags_SkipByteCodeOffset);

    const auto PrintOpCodeName = [&]() {
        Output::SkipToColumn(23);
#if DBG
        WORD oldValue = 0;
        if (this->highlight != 0)
        {
            oldValue = Output::SetConsoleForeground(this->highlight);
        }
#endif
        Output::Print(_u("%s "), Js::OpCodeUtil::GetOpCodeName(m_opcode));
#if DBG
        if (this->highlight != 0)
        {
            Output::SetConsoleForeground(oldValue);
        }
#endif
        Output::SkipToColumn(38);
    };

    // forward decl before goto statement
    Opnd * dst = nullptr;

    if(m_opcode == Js::OpCode::BoundCheck || m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        PrintOpCodeName();

        // src1 <= src2 + dst

        Assert(GetSrc1());
        if(GetSrc1()->IsIntConstOpnd())
        {
            Output::Print(_u("%d"), GetSrc1()->AsIntConstOpnd()->GetValue());
        }
        else
        {
            GetSrc1()->Dump(flags, m_func);
        }

        bool useLessThanOrEqual = true;
        bool usePlus = true;
        bool dumpSrc2 = false;
        int32 offset = GetDst() ? GetDst()->AsIntConstOpnd()->AsInt32() : 0;
        if(GetSrc2())
        {
            if(GetSrc2()->IsIntConstOpnd())
            {
            #if DBG
                int32 temp;
                Assert(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp));
            #endif
                offset += GetSrc2()->AsIntConstOpnd()->AsInt32();
            }
            else
            {
                dumpSrc2 = true;
                if(offset == -1)
                {
                    useLessThanOrEqual = false; // < instead of <=
                    offset = 0;
                }
                else if(offset < 0 && offset != IntConstMin)
                {
                    usePlus = false;
                    offset = -offset;
                }
            }
        }

        Output::Print(_u(" %S "), useLessThanOrEqual ? "<=" : "<");
        if(dumpSrc2)
        {
            GetSrc2()->Dump(flags, m_func);
        }
        if(offset != 0)
        {
            if(dumpSrc2)
            {
                Output::Print(_u(" %C "), usePlus ? '+' : '-');
            }
            Output::Print(_u("%d"), offset);
        }

        goto PrintByteCodeOffsetEtc;
    }

    Output::SkipToColumn(4);

    dst = this->GetDst();

    if (dst)
    {
        dst->Dump(flags, this->m_func);

        bool const dumpMarkTemp = PHASE_DUMP(Js::MarkTempPhase, m_func)
            || PHASE_TRACE(Js::MarkTempPhase, m_func);
        bool const dumpMarkTempNumber = dumpMarkTemp || PHASE_DUMP(Js::MarkTempNumberPhase, m_func)
            || PHASE_TRACE(Js::MarkTempNumberPhase, m_func);
        bool const dumpMarkTempObject = dumpMarkTemp || PHASE_DUMP(Js::MarkTempObjectPhase, m_func)
            || PHASE_TRACE(Js::MarkTempObjectPhase, m_func);

        if ((dumpMarkTempNumber && (this->dstIsTempNumberTransferred || this->dstIsTempNumber))
            || (dumpMarkTempObject && this->dstIsTempObject))
        {
            Output::Print(_u("["));

            if (dumpMarkTempNumber)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempNumberProducing(this->m_opcode))
                {
                    if (this->dstIsTempNumberTransferred)
                    {
                        Assert(this->dstIsTempNumber);
                        Output::Print(_u("x"));
                    }
                    else if (this->dstIsTempNumber)
                    {
                        Output::Print(_u("#"));
                    }
                }
            }
            if (dumpMarkTempObject)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempObjectProducing(this->m_opcode))
                {
                    if (this->dstIsTempObject)
                    {
                        Output::Print(_u("o"));
                    }
                }
            }

            Output::Print(_u("tmp]"));
        }
        if(PHASE_DUMP(Js::TrackNegativeZeroPhase, m_func->GetTopFunc()) && !ShouldCheckForNegativeZero())
        {
            Output::Print(_u("[-0]"));
        }
        if (PHASE_DUMP(Js::TypedArrayVirtualPhase, m_func->GetTopFunc()) && (!IsDstNotAlwaysConvertedToInt32() || !IsDstNotAlwaysConvertedToNumber()))
        {
            if (!IsDstNotAlwaysConvertedToInt32())
                Output::Print(_u("[->i]"));
            else
                Output::Print(_u("[->n]"));

        }
        if(PHASE_DUMP(Js::TrackIntOverflowPhase, m_func->GetTopFunc()))
        {
            // ignoring 32-bit overflow ?
            if(!ShouldCheckFor32BitOverflow())
            {
                // ignoring 32-bits or more ?
                if(ShouldCheckForNon32BitOverflow())
                    Output::Print(_u("[OF %d]"), ignoreOverflowBitCount);
                else
                    Output::Print(_u("[OF]"));
            }
        }

        if (this->isSafeToSpeculate)
        {
            Output::SkipToColumn(19);
            Output::Print(_u("<=="));
        }
        else
        {
            Output::SkipToColumn(20);
            Output::Print(_u("="));
        }
    }

    PrintOpCodeName();

    if (this->IsBranchInstr())
    {
        BranchInstr * branchInstr = this->AsBranchInstr();
        LabelInstr * targetInstr = branchInstr->GetTarget();
        bool labelPrinted = true;
        if (targetInstr == NULL)
        {
            // Checking the 'm_isMultiBranch' field here directly as well to bypass asserting when tracing IR builder
            if(branchInstr->m_isMultiBranch && branchInstr->IsMultiBranch())
            {
                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                // If this MultiBranchInstr has been lowered to a machine instruction, which means
                // its opcode is not Js::OpCode::MultiBr, there is no need to print the labels.
                if (this->m_opcode == Js::OpCode::MultiBr)
                {
                    multiBranchInstr->MapMultiBrLabels([](IR::LabelInstr * labelInstr) -> void
                    {
                        Output::Print(_u("$L%d "), labelInstr->m_id);
                    });
                }
                else
                {
                    labelPrinted = false;
                }
            }
            else
            {
                Output::Print(_u("??"));
            }
        }
        else
        {
            Output::Print(_u("$L%d"), targetInstr->m_id);
        }
        if (this->GetSrc1() && labelPrinted)
        {
            Output::Print(_u(", "));
        }
    }
    else if (this->IsPragmaInstr() && this->m_opcode == Js::OpCode::StatementBoundary)
    {
        Output::Print(_u("#%d"), this->AsPragmaInstr()->m_statementIndex);
    }

    // scope
    {
        Opnd * src1 = this->GetSrc1();
        if (this->m_opcode == Js::OpCode::NewScFunc || this->m_opcode == Js::OpCode::NewScGenFunc)
        {
            Assert(src1->IsIntConstOpnd());
            Js::ParseableFunctionInfo * function = nullptr;
            if (!m_func->IsOOPJIT())
            {
                function = ((Js::ParseableFunctionInfo *)m_func->GetJITFunctionBody()->GetAddr())->GetNestedFunctionForExecution((uint)src1->AsIntConstOpnd()->GetValue())->GetParseableFunctionInfo();
            }
            Output::Print(_u("func:%s()"), function ? function->GetDisplayName() : _u("???"));
            Output::Print(_u(", env:"));
            this->GetSrc2()->AsRegOpnd()->m_sym->Dump(flags);
        }
        else if (src1)
        {
            src1->Dump(flags, this->m_func);
            Opnd * src2 = this->GetSrc2();
            if (src2)
            {
                Output::Print(_u(", "));
                src2->Dump(flags, this->m_func);
            }
        }
    }

    if (this->IsByteCodeUsesInstr() || this->m_opcode == Js::OpCode::SpeculatedLoadFence)
    {
        ByteCodeUsesInstr* tempbcu = static_cast<ByteCodeUsesInstr*>(this);
        if (tempbcu->GetByteCodeUpwardExposedUsed())
        {
            bool first = true;
            FOREACH_BITSET_IN_SPARSEBV(id, tempbcu->GetByteCodeUpwardExposedUsed())
            {
                Output::Print(first? _u("s%d") : _u(", s%d"), id);
                first = false;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        if (tempbcu->propertySymUse)
        {
            Output::Print(_u("  PropSym: %d"), tempbcu->propertySymUse->m_id);
        }
    }

PrintByteCodeOffsetEtc:
    if (!AsmDumpMode && !SkipByteCodeOffset)
    {
        this->DumpByteCodeOffset();
    }

    if (!SimpleForm)
    {
        if (this->HasBailOutInfo() || this->HasAuxBailOut())
        {
            BailOutInfo * bailOutInfo = this->GetBailOutInfo();
            Output::SkipToColumn(85);
            if (!AsmDumpMode)
            {
                Output::Print(_u("Bailout: #%04x"), bailOutInfo->bailOutOffset);
            }
            if (!bailOutInfo->bailOutFunc->IsTopFunc())
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u(" Func %s"), bailOutInfo->bailOutFunc->GetDebugNumberSet(debugStringBuffer));
            }
            Output::Print(_u(" (%S)"), this->GetBailOutKindName());
        }
    }
    if ((flags & IRDumpFlags_SkipEndLine) == 0)
    {
        Output::Print(_u("\n"));
    }
}